

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.c
# Opt level: O0

char tutorial_translate_command(int command,nh_cmd_arg *arg)

{
  boolean bVar1;
  int iVar2;
  schar local_23;
  char local_22;
  char local_21;
  schar dz;
  schar dy;
  char *pcStack_20;
  schar dx;
  char *cmd_name;
  nh_cmd_arg *arg_local;
  int command_local;
  
  pcStack_20 = cmdlist[command].name;
  if (pcStack_20 == (char *)0x0) {
    arg_local._7_1_ = '\0';
  }
  else {
    cmd_name = (char *)arg;
    arg_local._0_4_ = command;
    iVar2 = strcmp(pcStack_20,"move");
    if (iVar2 == 0) {
      if ((cmdlist[(int)arg_local].flags & 0x1c) == 4) {
        bVar1 = dir_to_delta(*(nh_direction *)(cmd_name + 4),&local_21,&local_22,&local_23);
        if (bVar1 == '\0') {
          arg_local._7_1_ = '\0';
        }
        else {
          arg_local._7_1_ = 'b';
          if (local_21 != '\0' && local_22 != '\0') {
            arg_local._7_1_ = 'y';
          }
        }
      }
      else {
        arg_local._7_1_ = '\0';
      }
    }
    else {
      iVar2 = strcmp(pcStack_20,"run");
      if ((iVar2 == 0) || (iVar2 = strcmp(pcStack_20,"go2"), iVar2 == 0)) {
        arg_local._7_1_ = 'G';
      }
      else {
        iVar2 = strcmp(pcStack_20,"remove");
        if ((iVar2 == 0) || (iVar2 = strcmp(pcStack_20,"takeoff"), iVar2 == 0)) {
          arg_local._7_1_ = 'T';
        }
        else {
          iVar2 = strcmp(pcStack_20,"farlook");
          if (iVar2 == 0) {
            arg_local._7_1_ = ';';
          }
          else {
            iVar2 = strcmp(pcStack_20,"wield");
            if (iVar2 == 0) {
              arg_local._7_1_ = 'w';
            }
            else {
              iVar2 = strcmp(pcStack_20,"search");
              if (iVar2 == 0) {
                arg_local._7_1_ = 's';
              }
              else {
                iVar2 = strcmp(pcStack_20,"drop");
                if (iVar2 == 0) {
                  arg_local._7_1_ = 'd';
                }
                else {
                  iVar2 = strcmp(pcStack_20,"menuinv");
                  if (iVar2 == 0) {
                    arg_local._7_1_ = 'I';
                  }
                  else {
                    iVar2 = strcmp(pcStack_20,"throw");
                    if (iVar2 == 0) {
                      arg_local._7_1_ = 't';
                    }
                    else {
                      arg_local._7_1_ = '\0';
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return arg_local._7_1_;
}

Assistant:

static char tutorial_translate_command(int command, const struct nh_cmd_arg *arg)
{
	/* Borrowing this like allmain.c to translate commands. */
	extern const struct cmd_desc cmdlist[];

	const char *cmd_name = cmdlist[command].name;
	if (cmd_name == NULL)
	    return '\0'; /* Interesting... */

	if (!strcmp(cmd_name, "move")) {
	    /* Detect cardinal versus diagonal movement. */
	    if ((cmdlist[command].flags & CMD_ARG_FLAGS) == CMD_ARG_DIR) {
		schar dx, dy, dz;
		if (!dir_to_delta(arg->d, &dx, &dy, &dz))
		    return '\0'; /* Bad direction. */
		/* 'y' == diagonal, 'b' == cardinal
		   Presumably they were chosen because they'd never be
		   confused with command keys in either the classic
		   vi-keys or numpad configurations.
		   This tutorial doesn't track anything not in this
		   function anyway, so that won't be a problem here. */
		return (dx && dy) ? 'y' : 'b';
	    }
	    return '\0'; /* Move without direction? */
	} else if (!strcmp(cmd_name, "run") || !strcmp(cmd_name, "go2")) {
	    return 'G';
	} else if (!strcmp(cmd_name, "remove") || !strcmp(cmd_name, "takeoff")) {
	    return 'T';
	} else if (!strcmp(cmd_name, "farlook")) {
	    return ';';
	} else if (!strcmp(cmd_name, "wield")) {
	    return 'w';
	} else if (!strcmp(cmd_name, "search")) {
	    return 's';
	} else if (!strcmp(cmd_name, "drop")) {
	    return 'd';
	} else if (!strcmp(cmd_name, "menuinv")) {
	    return 'I';
	} else if (!strcmp(cmd_name, "throw")) {
	    return 't';
	}

	/* If check_tutorial_command doesn't check it, it doesn't matter. */
	return '\0';
}